

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Url.cpp
# Opt level: O0

bool __thiscall xmrig::Url::parse(Url *this,char *url)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *str;
  String *this_00;
  long lVar4;
  Url *in_RSI;
  undefined1 *in_RDI;
  char *host;
  size_t size;
  char *port;
  char *base;
  char *p;
  char *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb0;
  Url *local_28;
  Url *this_01;
  bool local_1;
  
  if (in_RSI == (Url *)0x0) {
    local_1 = false;
  }
  else {
    local_28 = in_RSI;
    pcVar2 = strstr(&in_RSI->m_tls,"://");
    this_01 = local_28;
    if (pcVar2 != (char *)0x0) {
      iVar1 = strncasecmp(&local_28->m_tls,"stratum+tcp://",0xe);
      if (iVar1 == 0) {
        *(undefined4 *)(in_RDI + 4) = 1;
        *in_RDI = 0;
        this_01 = local_28;
      }
      else {
        iVar1 = strncasecmp(&local_28->m_tls,"stratum+ssl://",0xe);
        if (iVar1 == 0) {
          *(undefined4 *)(in_RDI + 4) = 1;
          *in_RDI = 1;
          this_01 = local_28;
        }
        else {
          iVar1 = strncasecmp(&local_28->m_tls,"daemon+https://",0xf);
          if (iVar1 == 0) {
            *(undefined4 *)(in_RDI + 4) = 2;
            *in_RDI = 1;
            this_01 = local_28;
          }
          else {
            iVar1 = strncasecmp(&local_28->m_tls,"daemon+http://",0xe);
            if (iVar1 != 0) {
              return false;
            }
            *(undefined4 *)(in_RDI + 4) = 2;
            *in_RDI = 0;
            this_01 = local_28;
          }
        }
      }
      local_28 = (Url *)(pcVar2 + 3);
    }
    sVar3 = strlen(&local_28->m_tls);
    if ((sVar3 == 0) || (local_28->m_tls == true)) {
      local_1 = false;
    }
    else {
      String::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (local_28->m_tls == true) {
        local_1 = parseIPv6(this_01,pcVar2);
      }
      else {
        pcVar2 = strchr(&local_28->m_tls,0x3a);
        if (pcVar2 == (char *)0x0) {
          String::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          local_1 = true;
        }
        else {
          str = (char *)(((long)pcVar2 - (long)local_28) + 1);
          this_00 = (String *)operator_new__((ulong)str);
          memset(this_00,0,(size_t)str);
          memcpy(this_00,local_28,(long)pcVar2 - (long)local_28);
          String::operator=(this_00,str);
          lVar4 = strtol(pcVar2 + 1,(char **)0x0,10);
          *(short *)(in_RDI + 0x28) = (short)lVar4;
          local_1 = true;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool xmrig::Url::parse(const char *url)
{
    if (url == nullptr) {
        return false;
    }

    const char *p    = strstr(url, "://");
    const char *base = url;

    if (p) {
        if (strncasecmp(url, kStratumTcp, sizeof(kStratumTcp) - 1) == 0) {
            m_scheme = STRATUM;
            m_tls    = false;
        }
        else if (strncasecmp(url, kStratumSsl, sizeof(kStratumSsl) - 1) == 0) {
            m_scheme = STRATUM;
            m_tls    = true;
        }
#       ifdef XMRIG_FEATURE_HTTP
        else if (strncasecmp(url, kDaemonHttps, sizeof(kDaemonHttps) - 1) == 0) {
            m_scheme = DAEMON;
            m_tls    = true;
        }
        else if (strncasecmp(url, kDaemonHttp, sizeof(kDaemonHttp) - 1) == 0) {
            m_scheme = DAEMON;
            m_tls    = false;
        }
#       endif
        else {
            return false;
        }

        base = p + 3;
    }

    if (!strlen(base) || *base == '/') {
        return false;
    }

    m_url = url;
    if (base[0] == '[') {
        return parseIPv6(base);
    }

    const char *port = strchr(base, ':');
    if (!port) {
        m_host = base;
        return true;
    }

    const auto size = static_cast<size_t>(port++ - base + 1);
    char *host      = new char[size]();
    memcpy(host, base, size - 1);

    m_host = host;
    m_port = static_cast<uint16_t>(strtol(port, nullptr, 10));

    return true;
}